

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O2

void __thiscall raptor::Thread::Join(Thread *this)

{
  IThreadService *pIVar1;
  
  pIVar1 = this->_impl;
  if (pIVar1 == (IThreadService *)0x0) {
    if (this->_state != kFailed) {
      LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/util/thread.cc"
                     ,0xe9,kLogLevelError,"assertion failed: %s","_state == kFailed");
      abort();
    }
  }
  else {
    if (this->_state == kAlive) {
      this->_state = kActive;
      (*pIVar1->_vptr_IThreadService[2])();
      pIVar1 = this->_impl;
    }
    (*pIVar1->_vptr_IThreadService[3])();
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_state = kFinish;
    this->_impl = (IThreadService *)0x0;
  }
  return;
}

Assistant:

void Thread::Join() {
    if (_impl != nullptr) {
        if (_state == kAlive) {
            _state = kActive;
            _impl->Start();
        }
        _impl->Join();
        delete _impl;
        _state = kFinish;
        _impl = nullptr;
    } else {
        RAPTOR_ASSERT(_state == kFailed);
    }
}